

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O3

void test_new_delete(char *dir,char *file,vmemcache_repl_p repl_p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  char *__s1;
  char *__s1_00;
  size_t sVar4;
  VMEMcache *pVVar5;
  long lVar6;
  int *piVar7;
  VMEMcache *pVVar8;
  VMEMcache *cache;
  void *pvVar9;
  undefined8 extraout_RAX;
  void *__dest;
  uint __seed;
  undefined8 uVar10;
  ulong extraout_RDX;
  undefined4 uVar11;
  char *pcVar12;
  ulong uVar13;
  stat_t sVar14;
  undefined *puVar15;
  void *__src;
  void *pvVar16;
  size_t unaff_R13;
  ulong *puVar17;
  ulong *puVar18;
  ulong *puVar19;
  char *pcVar20;
  undefined **ppuVar21;
  undefined8 uStack_18c8;
  undefined8 uStack_18c0;
  undefined4 uStack_18b8;
  undefined4 uStack_18b4;
  undefined8 uStack_18b0;
  undefined1 auStack_18a8 [64];
  undefined1 auStack_1868 [32];
  undefined1 auStack_1848 [16];
  undefined1 *apuStack_1838 [2];
  long alStack_1828 [2];
  undefined1 *puStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 uStack_1800;
  undefined1 *puStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined1 *puStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 uStack_17c0;
  undefined1 *puStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_17a0;
  undefined1 *puStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 uStack_1780;
  undefined1 *puStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined1 *puStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 uStack_1740;
  undefined1 *puStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined1 *puStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 uStack_1700;
  undefined1 *puStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16e0;
  undefined1 *puStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 uStack_16c0;
  undefined1 *puStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_16a0;
  undefined1 *puStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 uStack_1680;
  undefined1 *puStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined1 *puStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 uStack_1640;
  long lStack_1638;
  VMEMcache *pVStack_1630;
  char *pcStack_1628;
  size_t sStack_1620;
  char *pcStack_1618;
  VMEMcache *pVStack_1610;
  code *pcStack_1608;
  VMEMcache *pVStack_1600;
  char *pcStack_15f8;
  ulong *puStack_15f0;
  VMEMcache *pVStack_15e8;
  code *pcStack_15e0;
  size_t *in_stack_ffffffffffffea28;
  stat_t in_stack_ffffffffffffea30;
  stat_t in_stack_ffffffffffffea38;
  size_t sStack_11c0;
  int iStack_11b4;
  ulong uStack_11b0;
  ulong uStack_11a8;
  VMEMcache *pVStack_11a0;
  char *pcStack_1198;
  code *pcStack_1178;
  long *plStack_1170;
  int iStack_1160;
  short sStack_115c;
  long lStack_1058;
  long lStack_1050;
  char *pcStack_1048;
  char *pcStack_1040;
  char *pcStack_1038;
  code *pcStack_1030;
  char local_1028 [4];
  char acStack_1024 [4];
  char nonexistent [4096];
  
  pcVar20 = (char *)(ulong)repl_p;
  pcStack_1030 = (code *)0x105a5d;
  __s1 = (char *)vmemcache_new();
  pcStack_1030 = (code *)0x105a6d;
  vmemcache_set_size(__s1,0x100000);
  pcStack_1030 = (code *)0x105a7a;
  vmemcache_set_extent_size(__s1,0x100);
  pcStack_1030 = (code *)0x105a85;
  vmemcache_set_eviction_policy(__s1,pcVar20);
  pcStack_1030 = (code *)0x105a90;
  pcVar12 = dir;
  __s1_00 = __s1;
  iVar1 = vmemcache_add();
  iVar2 = (int)pcVar12;
  if (iVar1 == 0) {
    pcStack_1030 = (code *)0x105aa0;
    vmemcache_delete(__s1);
    pcStack_1030 = (code *)0x105aa5;
    __s1 = (char *)vmemcache_new();
    pcStack_1030 = (code *)0x105ab5;
    vmemcache_set_size(__s1,0x100000);
    pcStack_1030 = (code *)0x105ac2;
    vmemcache_set_extent_size(__s1,0x100000);
    pcStack_1030 = (code *)0x105acd;
    vmemcache_set_eviction_policy(__s1,repl_p);
    pcStack_1030 = (code *)0x105ad8;
    pcVar12 = dir;
    __s1_00 = __s1;
    iVar1 = vmemcache_add();
    iVar2 = (int)pcVar12;
    if (iVar1 != 0) goto LAB_00105d78;
    pcStack_1030 = (code *)0x105ae8;
    vmemcache_delete(__s1);
    pcStack_1030 = (code *)0x105aed;
    __s1 = (char *)vmemcache_new();
    iVar2 = 1;
    pcStack_1030 = (code *)0x105afd;
    __s1_00 = __s1;
    iVar1 = vmemcache_set_extent_size();
    if (iVar1 == 0) goto LAB_00105d7d;
    pcStack_1030 = (code *)0x105b0d;
    vmemcache_delete(__s1);
    pcStack_1030 = (code *)0x105b12;
    __s1 = (char *)vmemcache_new();
    pcStack_1030 = (code *)0x105b22;
    vmemcache_set_size(__s1,0x100000);
    pcStack_1030 = (code *)0x105b31;
    iVar1 = vmemcache_set_extent_size(__s1,0xffffffffffffffff);
    if (iVar1 == 0) {
      pcStack_1030 = (code *)0x105b40;
      pcVar12 = dir;
      __s1_00 = __s1;
      iVar1 = vmemcache_add();
      iVar2 = (int)pcVar12;
      if (iVar1 != 0) goto LAB_00105b48;
      goto LAB_00105daf;
    }
LAB_00105b48:
    pcStack_1030 = (code *)0x105b50;
    vmemcache_delete(__s1);
    pcStack_1030 = (code *)0x105b55;
    __s1 = (char *)vmemcache_new();
    iVar2 = 0xff;
    pcStack_1030 = (code *)0x105b65;
    __s1_00 = __s1;
    iVar1 = vmemcache_set_extent_size();
    if (iVar1 == 0) goto LAB_00105d82;
    pcStack_1030 = (code *)0x105b75;
    vmemcache_delete(__s1);
    pcStack_1030 = (code *)0x105b7a;
    __s1 = (char *)vmemcache_new();
    pcStack_1030 = (code *)0x105b8a;
    vmemcache_set_size(__s1,0x100000);
    pcStack_1030 = (code *)0x105b97;
    iVar1 = vmemcache_set_extent_size(__s1,0x100001);
    if (iVar1 != 0) {
LAB_00105bae:
      pcStack_1030 = (code *)0x105bb6;
      vmemcache_delete(__s1);
      pcStack_1030 = (code *)0x105bbb;
      __s1 = (char *)vmemcache_new();
      iVar2 = 0xfffff;
      pcStack_1030 = (code *)0x105bcb;
      __s1_00 = __s1;
      iVar1 = vmemcache_set_size();
      if (iVar1 == 0) goto LAB_00105d87;
      pcStack_1030 = (code *)0x105bdb;
      vmemcache_delete(__s1);
      pcStack_1030 = (code *)0x105be0;
      __s1 = (char *)vmemcache_new();
      iVar2 = 1;
      pcStack_1030 = (code *)0x105bf0;
      __s1_00 = __s1;
      iVar1 = vmemcache_set_size();
      if (iVar1 == 0) goto LAB_00105d8c;
      pcStack_1030 = (code *)0x105c00;
      vmemcache_delete(__s1);
      pcStack_1030 = (code *)0x105c05;
      __s1 = (char *)vmemcache_new();
      iVar2 = -1;
      pcStack_1030 = (code *)0x105c17;
      __s1_00 = __s1;
      iVar1 = vmemcache_set_size();
      if (iVar1 == 0) goto LAB_00105d91;
      pcStack_1030 = (code *)0x105c27;
      vmemcache_delete(__s1);
      pcStack_1030 = (code *)0x105c2c;
      __s1 = (char *)vmemcache_new();
      pcStack_1030 = (code *)0x105c3c;
      vmemcache_set_size(__s1,0x100000);
      pcStack_1030 = (code *)0x105c49;
      vmemcache_set_extent_size(__s1,0x100);
      pcStack_1030 = (code *)0x105c54;
      vmemcache_set_eviction_policy(__s1,pcVar20);
      pcStack_1030 = (code *)0x105c5f;
      pcVar12 = file;
      __s1_00 = __s1;
      iVar1 = vmemcache_add();
      iVar2 = (int)pcVar12;
      if (iVar1 == 0) goto LAB_00105d96;
      pcStack_1030 = (code *)0x105c6c;
      __s1_00 = (char *)vmemcache_errormsg();
      iVar2 = 0x107353;
      pcStack_1030 = (code *)0x105c7b;
      iVar1 = strcmp(__s1_00,"open: Not a directory");
      if (iVar1 != 0) goto LAB_00105d9b;
      pcStack_1030 = (code *)0x105c8b;
      vmemcache_delete(__s1);
      pcStack_1030 = (code *)0x105c90;
      file = (char *)vmemcache_new();
      pcStack_1030 = (code *)0x105ca0;
      vmemcache_set_size(file,0x100000);
      pcStack_1030 = (code *)0x105cad;
      vmemcache_set_extent_size(file,0x100);
      pcStack_1030 = (code *)0x105cb8;
      vmemcache_set_eviction_policy(file);
      iVar2 = 0;
      pcStack_1030 = (code *)0x105cc2;
      __s1_00 = file;
      iVar1 = vmemcache_add();
      if (iVar1 == 0) goto LAB_00105da0;
      pcStack_1030 = (code *)0x105ccf;
      __s1_00 = (char *)vmemcache_errormsg();
      iVar2 = 0x1073dd;
      pcStack_1030 = (code *)0x105cde;
      iVar1 = strcmp(__s1_00,"invalid (NULL) path");
      if (iVar1 != 0) goto LAB_00105da5;
      pcStack_1030 = (code *)0x105cee;
      vmemcache_delete(file);
      pcStack_1030 = (code *)0x105cf3;
      file = (char *)vmemcache_new();
      pcStack_1030 = (code *)0x105d03;
      vmemcache_set_size(file,0x100000);
      pcStack_1030 = (code *)0x105d10;
      vmemcache_set_extent_size(file,0x100);
      pcStack_1030 = (code *)0x105d1b;
      vmemcache_set_eviction_policy(file,repl_p);
      pcVar20 = local_1028;
      pcStack_1030 = (code *)0x105d2d;
      strcpy(pcVar20,dir);
      pcStack_1030 = (code *)0x105d35;
      sVar4 = strlen(pcVar20);
      builtin_strncpy(local_1028 + sVar4,"/non",4);
      builtin_strncpy(acStack_1024 + sVar4,"exis",4);
      builtin_strncpy(nonexistent + sVar4,"tent_dir",9);
      pcStack_1030 = (code *)0x105d57;
      pcVar12 = pcVar20;
      __s1_00 = file;
      iVar1 = vmemcache_add();
      iVar2 = (int)pcVar12;
      if (iVar1 != 0) {
        pcStack_1030 = (code *)0x105d63;
        vmemcache_delete(file);
        return;
      }
      goto LAB_00105daa;
    }
    pcStack_1030 = (code *)0x105ba6;
    pcVar12 = dir;
    __s1_00 = __s1;
    iVar1 = vmemcache_add();
    iVar2 = (int)pcVar12;
    if (iVar1 != 0) goto LAB_00105bae;
  }
  else {
    pcStack_1030 = (code *)0x105d78;
    test_new_delete_cold_1();
LAB_00105d78:
    pcStack_1030 = (code *)0x105d7d;
    test_new_delete_cold_2();
LAB_00105d7d:
    pcStack_1030 = (code *)0x105d82;
    test_new_delete_cold_14();
LAB_00105d82:
    pcStack_1030 = (code *)0x105d87;
    test_new_delete_cold_12();
LAB_00105d87:
    pcStack_1030 = (code *)0x105d8c;
    test_new_delete_cold_10();
LAB_00105d8c:
    pcStack_1030 = (code *)0x105d91;
    test_new_delete_cold_9();
LAB_00105d91:
    pcStack_1030 = (code *)0x105d96;
    test_new_delete_cold_8();
LAB_00105d96:
    pcStack_1030 = (code *)0x105d9b;
    test_new_delete_cold_7();
LAB_00105d9b:
    pcStack_1030 = (code *)0x105da0;
    test_new_delete_cold_3();
LAB_00105da0:
    pcStack_1030 = (code *)0x105da5;
    test_new_delete_cold_6();
LAB_00105da5:
    pcStack_1030 = (code *)0x105daa;
    test_new_delete_cold_4();
LAB_00105daa:
    pcStack_1030 = (code *)0x105daf;
    test_new_delete_cold_5();
LAB_00105daf:
    pcStack_1030 = (code *)0x105db4;
    test_new_delete_cold_13();
  }
  pcStack_1030 = test_put_get_evict;
  test_new_delete_cold_11();
  pcStack_1178 = (code *)0x105dd4;
  pcStack_1048 = dir;
  pcStack_1040 = pcVar20;
  pcStack_1038 = file;
  pcStack_1030 = (code *)&stack0xfffffffffffffff8;
  pVVar5 = (VMEMcache *)vmemcache_new();
  pcStack_1178 = (code *)0x105de4;
  vmemcache_set_size(pVVar5,0x100000);
  pcStack_1178 = (code *)0x105df1;
  vmemcache_set_extent_size(pVVar5,0x100);
  pcStack_1178 = (code *)0x105dfc;
  vmemcache_set_eviction_policy(pVVar5,iVar2);
  pcStack_1178 = (code *)0x105e07;
  iVar1 = vmemcache_add(pVVar5,__s1_00);
  if (iVar1 == 0) {
    pcStack_1178 = (code *)0x105e30;
    iVar1 = vmemcache_put(pVVar5,"KEY",4,"VALUE");
    if (iVar1 != 0) goto LAB_00105f7f;
    pcStack_1178 = (code *)0x105e45;
    verify_stat_entries(pVVar5,1);
    lStack_1050 = 0;
    pcStack_1178 = (code *)0x105e65;
    iVar1 = vmemcache_exists(pVVar5,"KEY",4,&lStack_1058);
    if (iVar1 != 1) goto LAB_00105f84;
    iVar1 = 0x10748e;
    pcStack_1178 = (code *)0x105e9a;
    plStack_1170 = &lStack_1050;
    lVar6 = vmemcache_get(pVVar5,"KEY",4,&iStack_1160,0x100,0);
    if (lVar6 < 0) goto LAB_00105f8b;
    if (lStack_1058 != lStack_1050) goto LAB_00105f90;
    if (lVar6 != 6) goto LAB_00105f9d;
    if (lStack_1058 != 6) goto LAB_00105fa5;
    if (sStack_115c != 0x45 || iStack_1160 != 0x554c4156) goto LAB_00105fae;
    if (iVar2 == 0) {
      iVar1 = 0x10748e;
      uVar10 = 4;
    }
    else {
      iVar1 = 0;
      uVar10 = 0;
    }
    pcStack_1178 = (code *)0x105f04;
    iVar2 = vmemcache_evict(pVVar5,iVar1,uVar10);
    if (iVar2 == -1) goto LAB_00105fba;
    pcStack_1178 = (code *)0x105f35;
    plStack_1170 = &lStack_1050;
    lVar6 = vmemcache_get(pVVar5,"KEY",4,&iStack_1160,0x100,0);
    if (lVar6 != -1) {
LAB_00105f75:
      pcStack_1178 = (code *)0x105f7a;
      test_put_get_evict_cold_8();
      goto LAB_00105f7a;
    }
    pcStack_1178 = (code *)0x105f40;
    piVar7 = __errno_location();
    if (*piVar7 != 2) goto LAB_00105f75;
    iVar1 = 0x10748e;
    pcStack_1178 = (code *)0x105f5b;
    uVar3 = vmemcache_exists(pVVar5,"KEY",4,0);
    if (uVar3 == 0) {
      pcStack_1178 = (code *)0x105f67;
      vmemcache_delete(pVVar5);
      return;
    }
  }
  else {
LAB_00105f7a:
    pcStack_1178 = (code *)0x105f7f;
    test_put_get_evict_cold_1();
LAB_00105f7f:
    pcStack_1178 = (code *)0x105f84;
    test_put_get_evict_cold_2();
LAB_00105f84:
    pcStack_1178 = (code *)0x105f8b;
    test_put_get_evict_cold_3();
LAB_00105f8b:
    pcStack_1178 = (code *)0x105f90;
    test_put_get_evict_cold_11();
LAB_00105f90:
    iVar1 = (int)&lStack_1050;
    pcStack_1178 = (code *)0x105f9d;
    test_put_get_evict_cold_4();
LAB_00105f9d:
    pcStack_1178 = (code *)0x105fa5;
    test_put_get_evict_cold_5();
LAB_00105fa5:
    pcStack_1178 = (code *)0x105fae;
    test_put_get_evict_cold_6();
LAB_00105fae:
    pcStack_1178 = (code *)0x105fba;
    test_put_get_evict_cold_7();
LAB_00105fba:
    pcStack_1178 = (code *)0x105fbf;
    test_put_get_evict_cold_10();
    uVar3 = extraout_EAX;
  }
  puVar17 = (ulong *)(ulong)uVar3;
  pcStack_1178 = test_memory_leaks;
  test_put_get_evict_cold_9();
  pcStack_15e0 = (code *)0x105fe7;
  iStack_11b4 = iVar1;
  pVStack_11a0 = pVVar5;
  pcStack_1198 = __s1;
  pcStack_1178 = (code *)&pcStack_1030;
  srand(__seed);
  uStack_11a8 = 0;
  uStack_11b0 = 0;
  pcStack_15e0 = (code *)0x105ff6;
  pVVar8 = (VMEMcache *)vmemcache_new();
  pcStack_15e0 = (code *)0x106006;
  vmemcache_set_size(pVVar8,0x100000);
  pcStack_15e0 = (code *)0x106013;
  vmemcache_set_extent_size(pVVar8,0x100);
  pcStack_15e0 = (code *)0x106020;
  vmemcache_set_eviction_policy(pVVar8,1);
  pcStack_15e0 = (code *)0x10602b;
  puVar19 = puVar17;
  ppuVar21 = (undefined **)pVVar8;
  iVar1 = vmemcache_add();
  uVar3 = (uint)puVar19;
  if (iVar1 == 0) {
    pcStack_15e0 = (code *)0x106049;
    vmemcache_callback_on_evict(pVVar8,on_evict_test_memory_leaks_cb,&uStack_11b0);
    if (uStack_11b0 < 1000) {
      puVar19 = (ulong *)0x0;
      pcVar20 = __s1;
      do {
        pcStack_15e0 = (code *)0x106064;
        iVar1 = rand();
        puVar17 = (ulong *)(long)iVar1;
        pVVar5 = (VMEMcache *)(((ulong)puVar17 / 0xff81) * 0xff81);
        unaff_R13 = (ulong)puVar17 % 0xff81 + 0x80;
        pcStack_15e0 = (code *)0x10609b;
        __s1 = (char *)malloc(unaff_R13);
        if (__s1 == (char *)0x0) {
LAB_0010622e:
          __s1 = pcVar20;
          pcStack_15e0 = (code *)0x106233;
          test_memory_leaks_cold_9();
          puVar18 = puVar17;
LAB_00106233:
          puVar17 = puVar18;
          pcStack_15e0 = (code *)0x106238;
          test_memory_leaks_cold_8();
LAB_00106238:
          pcStack_15e0 = (code *)0x106243;
          test_memory_leaks_cold_5();
LAB_00106243:
          pcStack_15e0 = (code *)0x10624f;
          test_memory_leaks_cold_4();
LAB_0010624f:
          pcStack_15e0 = (code *)0x10625a;
          test_memory_leaks_cold_3();
LAB_0010625a:
          ppuVar21 = (undefined **)&uStack_11a8;
          uVar3 = (uint)&uStack_11b0;
          pcStack_15e0 = (code *)0x106267;
          test_memory_leaks_cold_2();
          goto LAB_00106267;
        }
        puVar18 = (ulong *)((ulong)puVar17 % 0xff81);
        pcStack_15e0 = (code *)0x1060bb;
        memset(__s1,0x2a,(size_t)((long)puVar18 + 0x7f));
        (__s1 + 0x7f)[(long)puVar18] = '\0';
        if (iStack_11b4 == 0) {
          uVar10 = 8;
          puVar17 = &uStack_11a8;
        }
        else {
          puVar17 = (ulong *)&stack0xffffffffffffea30;
          pcStack_15e0 = (code *)0x1060e0;
          memset(puVar17,0x2a,0x400);
          uVar10 = 0x408;
          puVar18 = puVar17;
        }
        pcStack_15e0 = (code *)0x10610c;
        iVar1 = vmemcache_put(pVVar8,puVar17,uVar10,__s1,unaff_R13);
        puVar17 = puVar18;
        if (iVar1 != 0) goto LAB_0010625a;
        pcStack_15e0 = (code *)0x10611c;
        puVar17 = (ulong *)malloc(unaff_R13);
        if (puVar17 == (ulong *)0x0) goto LAB_00106233;
        if (iStack_11b4 == 0) {
          uVar10 = 8;
          puVar18 = &uStack_11a8;
        }
        else {
          uVar10 = 0x408;
          puVar18 = (ulong *)&stack0xffffffffffffea30;
        }
        in_stack_ffffffffffffea28 = &sStack_11c0;
        pcStack_15e0 = (code *)0x106169;
        sVar4 = vmemcache_get(pVVar8,puVar18,uVar10,puVar17,unaff_R13,0);
        pcVar20 = __s1;
        if ((long)sVar4 < 0) {
          pcStack_15e0 = (code *)0x10622e;
          test_memory_leaks_cold_7();
          goto LAB_0010622e;
        }
        if (sVar4 != unaff_R13) goto LAB_0010624f;
        if (unaff_R13 != sStack_11c0) goto LAB_00106243;
        pcStack_15e0 = (code *)0x106190;
        iVar1 = strcmp(__s1,(char *)puVar17);
        if (iVar1 != 0) goto LAB_00106238;
        pcStack_15e0 = (code *)0x1061a0;
        free(__s1);
        pcStack_15e0 = (code *)0x1061a8;
        free(puVar17);
        puVar19 = (ulong *)((long)puVar19 + 1);
        uVar13 = uStack_11a8 + 1;
        uStack_11a8 = uVar13;
      } while (uStack_11b0 < 1000);
    }
    else {
      uVar13 = 0;
      puVar19 = (ulong *)0x0;
    }
    pcStack_15e0 = (code *)0x1061dc;
    verify_stat_entries(pVVar8,uVar13 - uStack_11b0);
    do {
      pcStack_15e0 = (code *)0x1061e8;
      iVar1 = vmemcache_evict(pVVar8,0,0);
    } while (iVar1 == 0);
    pcStack_15e0 = (code *)0x106205;
    uVar13 = uStack_11a8;
    verify_stats(pVVar8,uStack_11a8,(stat_t)puVar19,(stat_t)puVar19,0,uStack_11b0,
                 (stat_t)in_stack_ffffffffffffea28,in_stack_ffffffffffffea30,
                 in_stack_ffffffffffffea38);
    uVar3 = (uint)uVar13;
    pcStack_15e0 = (code *)0x10620d;
    ppuVar21 = (undefined **)pVVar8;
    vmemcache_delete();
    puVar17 = puVar19;
    if (uStack_11b0 == uStack_11a8) {
      return;
    }
  }
  else {
LAB_00106267:
    pcStack_15e0 = (code *)0x10626c;
    test_memory_leaks_cold_1();
  }
  pcStack_15e0 = test_merge_allocations;
  test_memory_leaks_cold_6();
  pcVar20 = (char *)(ulong)uVar3;
  pcStack_1608 = (code *)0x106287;
  pVStack_1600 = pVVar5;
  pcStack_15f8 = __s1;
  puStack_15f0 = puVar17;
  pVStack_15e8 = pVVar8;
  pcStack_15e0 = (code *)&pcStack_1178;
  cache = (VMEMcache *)vmemcache_new();
  pcStack_1608 = (code *)0x106297;
  vmemcache_set_size(cache,0x100000);
  pcStack_1608 = (code *)0x1062a4;
  vmemcache_set_extent_size(cache,0x100);
  pcStack_1608 = (code *)0x1062af;
  vmemcache_set_eviction_policy(cache,pcVar20);
  pcStack_1608 = (code *)0x1062ba;
  pVVar5 = (VMEMcache *)ppuVar21;
  pVVar8 = cache;
  iVar1 = vmemcache_add();
  uVar11 = SUB84(pVVar5,0);
  if (iVar1 != 0) goto LAB_001063ba;
  __s1 = (char *)0x0;
  sVar14 = 0;
  pcStack_1608 = (code *)0x1062cf;
  verify_stat_entries(cache,0);
  pcStack_1608 = (code *)0x1062d7;
  verify_heap_entries(cache,sVar14);
  ppuVar21 = &PTR_anon_var_dwarf_5a6_0010ada0;
  pcVar20 = "VALUE";
  do {
    uVar10 = *(undefined8 *)(__s1 + 0x10ada0);
    pcStack_1608 = (code *)0x1062ff;
    pVVar8 = cache;
    iVar1 = vmemcache_put(cache,uVar10,6,"VALUE",6);
    uVar11 = (undefined4)uVar10;
    if (iVar1 != 0) {
      pcStack_1608 = (code *)0x1063b5;
      test_merge_allocations_cold_2();
      goto LAB_001063b5;
    }
    __s1 = __s1 + 8;
  } while (__s1 != (char *)0x28);
  sVar14 = 5;
  pcStack_1608 = (code *)0x10631e;
  verify_stat_entries(cache,5);
  pcStack_1608 = (code *)0x106326;
  verify_heap_entries(cache,sVar14);
  pcVar20 = (char *)0x0;
  __s1 = "\x01";
  do {
    puVar15 = (&PTR_anon_var_dwarf_5a6_0010ada0)[*(uint *)((long)&DAT_00107c20 + (long)pcVar20)];
    pcStack_1608 = (code *)0x106345;
    pVVar8 = cache;
    iVar1 = vmemcache_evict(cache,puVar15,6);
    uVar11 = SUB84(puVar15,0);
    if (iVar1 == -1) goto LAB_001063b5;
    pcVar20 = pcVar20 + 4;
  } while (pcVar20 != (char *)0x14);
  sVar14 = 0;
  pcStack_1608 = (code *)0x10635e;
  verify_stat_entries(cache,0);
  pcStack_1608 = (code *)0x106366;
  verify_heap_entries(cache,sVar14);
  uVar11 = 0x1079b7;
  pcStack_1608 = (code *)0x106387;
  pVVar8 = cache;
  iVar1 = vmemcache_put(cache,"KEY_1",6,"VALUE",6);
  if (iVar1 == 0) {
    sVar14 = 1;
    pcStack_1608 = (code *)0x106398;
    verify_stat_entries(cache,1);
    pcStack_1608 = (code *)0x1063a0;
    verify_heap_entries(cache,sVar14);
    vmemcache_delete(cache);
    return;
  }
  goto LAB_001063bf;
LAB_001063b5:
  pcStack_1608 = (code *)0x1063ba;
  test_merge_allocations_cold_4();
LAB_001063ba:
  pcStack_1608 = (code *)0x1063bf;
  test_merge_allocations_cold_1();
LAB_001063bf:
  pcStack_1608 = test_offsets;
  test_merge_allocations_cold_3();
  pVVar5 = (VMEMcache *)auStack_18a8;
  apuStack_1838[0] = auStack_1868;
  apuStack_1838[1] = (undefined1 *)0x20;
  alStack_1828[0] = 0;
  alStack_1828[1] = 0x20;
  uStack_1810 = 0x20;
  uStack_1808 = 2;
  uStack_1800 = 0x1e;
  uStack_17f0 = 0x20;
  uStack_17e8 = 0x1f;
  uStack_17e0 = 1;
  uStack_17d0 = 0x20;
  uStack_17c8 = 0x20;
  uStack_17c0 = 0;
  uStack_17b0 = 0x20;
  uStack_17a8 = 0x21;
  uStack_17a0 = 0;
  puStack_1798 = auStack_18a8;
  uStack_1790 = 0x40;
  uStack_1788 = 0;
  uStack_1780 = 0x20;
  uStack_1770 = 0x40;
  uStack_1768 = 4;
  uStack_1760 = 0x1c;
  uStack_1750 = 0x40;
  uStack_1748 = 0x1f;
  uStack_1740 = 1;
  uStack_1730 = 0x40;
  uStack_1728 = 0x20;
  uStack_1720 = 0;
  uStack_1710 = 0x40;
  uStack_1708 = 0x21;
  uStack_1700 = 0;
  puStack_16f8 = auStack_1848;
  uStack_16f0 = 0x10;
  uStack_16e8 = 0;
  uStack_16e0 = 0x10;
  uStack_16d0 = 0x10;
  uStack_16c8 = 2;
  uStack_16c0 = 0x10;
  uStack_16b0 = 0x10;
  uStack_16a8 = 0x10;
  uStack_16a0 = 0x10;
  uStack_1690 = 0x10;
  uStack_1688 = 0x12;
  uStack_1680 = 0xe;
  uStack_1670 = 0x10;
  uStack_1668 = 0x20;
  uStack_1660 = 0;
  uStack_1650 = 0x10;
  uStack_1648 = 0x21;
  uStack_1640 = 0;
  uStack_18b0 = 0x1065d6;
  puStack_1818 = apuStack_1838[0];
  puStack_17f8 = apuStack_1838[0];
  puStack_17d8 = apuStack_1838[0];
  puStack_17b8 = apuStack_1838[0];
  puStack_1778 = puStack_1798;
  puStack_1758 = puStack_1798;
  puStack_1738 = puStack_1798;
  puStack_1718 = puStack_1798;
  puStack_16d8 = puStack_16f8;
  puStack_16b8 = puStack_16f8;
  puStack_1698 = puStack_16f8;
  puStack_1678 = puStack_16f8;
  puStack_1658 = puStack_16f8;
  pVStack_1630 = cache;
  pcStack_1628 = __s1;
  sStack_1620 = unaff_R13;
  pcStack_1618 = pcVar20;
  pVStack_1610 = (VMEMcache *)ppuVar21;
  pcStack_1608 = (code *)&pcStack_15e0;
  pvVar9 = (void *)vmemcache_new();
  uStack_18b0 = 0x1065e6;
  vmemcache_set_size(pvVar9,0x100000);
  uStack_18b0 = 0x1065f3;
  vmemcache_set_extent_size(pvVar9,0x100);
  uStack_18b0 = 0x1065fe;
  vmemcache_set_eviction_policy(pvVar9,uVar11);
  uStack_18b0 = 0x106609;
  pvVar16 = pvVar9;
  iVar1 = vmemcache_add(pvVar9,pVVar8);
  if (iVar1 == 0) {
    pVVar5 = (VMEMcache *)&uStack_18c8;
    uStack_18c8 = 0x6867666564636261;
    uStack_18c0 = 0x706f6e6d6c6b6a69;
    uStack_18b8 = 0x74737271;
    uStack_18b4 = 0x78777675;
    uStack_18b0 = 0x7f7e7d7c7b7a79;
    pvVar16 = pvVar9;
    iVar1 = vmemcache_put(pvVar9,"KEY",4,pVVar5,0x20);
    pVVar8 = pVVar5;
    if (iVar1 == 0) {
      lVar6 = 0;
      while (sVar4 = vmemcache_get(pvVar9,"KEY",4,*(undefined8 *)((long)apuStack_1838 + lVar6),
                                   *(undefined8 *)((long)apuStack_1838 + lVar6 + 8),
                                   *(undefined8 *)((long)alStack_1828 + lVar6),&lStack_1638),
            sVar4 == *(size_t *)((long)alStack_1828 + lVar6 + 8)) {
        if (lStack_1638 != 0x20) {
          test_offsets_cold_4();
          break;
        }
        if ((0 < (long)sVar4) &&
           (iVar1 = strncmp(*(char **)((long)apuStack_1838 + lVar6),
                            (char *)(pVVar5 + *(long *)((long)alStack_1828 + lVar6)),sVar4),
           iVar1 != 0)) goto LAB_0010670d;
        lVar6 = lVar6 + 0x20;
        if (lVar6 == 0x200) {
          vmemcache_delete(pvVar9);
          return;
        }
      }
      test_offsets_cold_3();
LAB_0010670d:
      pvVar16 = (void *)((long)apuStack_1838 + lVar6);
      test_offsets_cold_5();
      goto LAB_00106720;
    }
  }
  else {
LAB_00106720:
    *(undefined8 *)(pVVar5 + -8) = 0x106725;
    test_offsets_cold_1();
  }
  *(code **)(pVVar5 + -8) = test_vmemcache_get_stat;
  test_offsets_cold_2();
  *(code ***)(pVVar5 + -8) = &pcStack_1608;
  *(VMEMcache **)(pVVar5 + -0x10) = pVVar8;
  pVVar8 = pVVar5 + -0x18;
  *(void **)(pVVar5 + -0x18) = pvVar9;
  *(undefined8 *)(pVVar5 + -0x20) = 0x106739;
  uVar10 = vmemcache_new();
  *(undefined8 *)(pVVar5 + -0x20) = 0x106749;
  vmemcache_set_size(uVar10,0x100000);
  *(undefined8 *)(pVVar5 + -0x20) = 0x106756;
  vmemcache_set_extent_size(uVar10,0x100);
  *(undefined8 *)(pVVar5 + -0x20) = 0x106761;
  pvVar9 = pvVar16;
  iVar1 = vmemcache_add(uVar10);
  if (iVar1 == 0) {
    pVVar8 = pVVar5 + -0x28;
    pvVar9 = (void *)0x0;
    *(undefined8 *)(pVVar5 + -0x30) = 0x10677c;
    iVar1 = vmemcache_get_stat(uVar10,0,pVVar8,9);
    if (iVar1 != 0) {
      *(undefined8 *)(pVVar5 + -0x30) = 0x106785;
      piVar7 = __errno_location();
      if (*piVar7 == 0x16) {
        *(undefined8 *)(pVVar5 + -0x30) = 0x106792;
        vmemcache_delete(uVar10);
        return;
      }
      goto LAB_001067a5;
    }
  }
  else {
    *(undefined8 *)(pVVar5 + -0x20) = 0x1067a0;
    test_vmemcache_get_stat_cold_1();
  }
  *(undefined8 *)(pVVar8 + -8) = 0x1067a5;
  test_vmemcache_get_stat_cold_3();
LAB_001067a5:
  *(code **)(pVVar8 + -8) = verify_stat_entries;
  test_vmemcache_get_stat_cold_2();
  *(VMEMcache **)(pVVar8 + -8) = pVVar5 + -8;
  *(undefined8 *)(pVVar8 + -0x10) = uVar10;
  *(undefined8 *)(pVVar8 + -0x18) = extraout_RAX;
  __dest = (void *)0x8;
  *(undefined8 *)(pVVar8 + -0x20) = 0x1067c9;
  iVar1 = vmemcache_get_stat();
  if (iVar1 == -1) {
    *(undefined8 *)(pVVar8 + -0x20) = 0x1067e0;
    verify_stat_entries_cold_2();
  }
  else if (*(void **)(pVVar8 + -0x18) == pvVar9) {
    return;
  }
  *(code **)(pVVar8 + -0x20) = on_evict_test_evict_cb;
  __src = pvVar9;
  verify_stat_entries_cold_1();
  *(VMEMcache **)(pVVar8 + -0x20) = pVVar8 + -8;
  *(long *)((long)__dest + 0x118) = *(long *)((long)__dest + 0x118) + 1;
  *(long *)(pVVar8 + -0x30) = (long)__dest + 0x108;
  *(undefined8 *)(pVVar8 + -0x38) = 0x106815;
  lVar6 = vmemcache_get();
  if (lVar6 < 0) {
    *(undefined8 *)(pVVar8 + -0x38) = 0x10682d;
    on_evict_test_evict_cb_cold_2();
  }
  else if (lVar6 == 0x100) {
    return;
  }
  *(code **)(pVVar8 + -0x38) = on_miss_test_evict_cb;
  on_evict_test_evict_cb_cold_1();
  *(VMEMcache **)(pVVar8 + -0x38) = pVVar8 + -0x20;
  *(void **)(pVVar8 + -0x40) = pvVar16;
  *(void **)(pVVar8 + -0x48) = pvVar9;
  *(long *)((long)__dest + 0x110) = *(long *)((long)__dest + 0x110) + 1;
  uVar13 = extraout_RDX;
  if (*(ulong *)((long)__dest + 0x100) < extraout_RDX) {
    uVar13 = *(ulong *)((long)__dest + 0x100);
  }
  *(undefined8 *)(pVVar8 + -0x50) = 0x106862;
  memcpy(__dest,__src,uVar13);
  *(ulong *)((long)__dest + 0x108) = uVar13;
  return;
}

Assistant:

static void
test_new_delete(const char *dir, const char *file, enum vmemcache_repl_p repl_p)
{
	VMEMcache *cache;

	/* TEST #1 - minimum values of max_size and extent_size */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_delete(cache);

	/* TEST #2 - extent_size = max_size = VMEMCACHE_MIN_POOL */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_delete(cache);

	/* TEST #3 - extent_size == 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_extent_size(cache, 1))
		UT_FATAL(
			"vmemcache_set_extent_size did not fail with extent_size == 1");

	vmemcache_delete(cache);

	/* TEST #4 - extent_size == -1 */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	if (!vmemcache_set_extent_size(cache, (size_t)-1) &&
		!vmemcache_add(cache, dir)) {
		UT_FATAL("vmemcache_new did not fail with extent_size == -1");
	}
	vmemcache_delete(cache);

	/* TEST #5 - extent_size == VMEMCACHE_MIN_EXTENT - 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT - 1))
		UT_FATAL(
			"vmemcache_new did not fail with extent_size == VMEMCACHE_MIN_EXTENT - 1");
	vmemcache_delete(cache);

	/* TEST #6 - extent_size == max_size + 1 */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	if (!vmemcache_set_extent_size(cache, VMEMCACHE_MIN_POOL + 1) &&
		!vmemcache_add(cache, dir)) {
		UT_FATAL(
			"vmemcache_new did not fail with extent_size == max_size + 1");
	}
	vmemcache_delete(cache);

	/* TEST #7 - size == VMEMCACHE_MIN_POOL - 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, VMEMCACHE_MIN_POOL - 1))
		UT_FATAL(
			"vmemcache_new did not fail with size == VMEMCACHE_MIN_POOL - 1");
	vmemcache_delete(cache);

	/* TEST #8 - size == 1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, 1))
		UT_FATAL(
			"vmemcache_new did not fail with size == 1");
	vmemcache_delete(cache);

	/* TEST #9 - size == -1 */
	cache = vmemcache_new();
	if (!vmemcache_set_size(cache, (size_t)-1))
		UT_FATAL(
			"vmemcache_new did not fail with size == -1");
	vmemcache_delete(cache);

	/* TEST #10 - not a directory, but a file */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (!vmemcache_add(cache, file))
		UT_FATAL(
			"vmemcache_new did not fail with a file instead of a directory");

#define ERR_MSG_1 "open: Not a directory"
	if (strcmp(vmemcache_errormsg(), ERR_MSG_1))
		UT_FATAL("wrong error message: '%s' (should be '"ERR_MSG_1"')",
			vmemcache_errormsg());
	vmemcache_delete(cache);

	/* TEST #11 - NULL directory path */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (!vmemcache_add(cache, NULL))
		UT_FATAL(
			"vmemcache_new did not fail with a NULL directory path");

#define ERR_MSG_2 "invalid (NULL) path"
	if (strcmp(vmemcache_errormsg(), ERR_MSG_2))
		UT_FATAL("wrong error message: '%s' (should be '"ERR_MSG_2"')",
			vmemcache_errormsg());
	vmemcache_delete(cache);

	/* TEST #12 - nonexistent directory path */
	cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	char nonexistent[PATH_MAX];
	strcpy(nonexistent, dir);
	strcat(nonexistent, "/nonexistent_dir");
	if (!vmemcache_add(cache, nonexistent))
		UT_FATAL(
			"vmemcache_new did not fail with a nonexistent directory path");
	vmemcache_delete(cache);
}